

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindowPrivate::setVisible(QMdiSubWindowPrivate *this,WindowStateAction action,bool visible)

{
  bool bVar1;
  QAction *pQVar2;
  QMdiSubWindow *pQVar3;
  QPointer<QMdi::ControlContainer> *this_00;
  ControllerWidget *pCVar4;
  undefined1 in_DL;
  undefined4 in_ESI;
  QMdiSubWindowPrivate *in_RDI;
  ControllerWidget *ctrlWidget;
  QMdiSubWindow *q;
  QMdiSubWindow *in_stack_00000040;
  ControlContainer *in_stack_00000048;
  ControlContainer *in_stack_ffffffffffffffc8;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar5;
  
  uVar5 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x63220a);
  if (bVar1) {
    pQVar2 = QPointer<QAction>::operator->((QPointer<QAction> *)0x63222c);
    QAction::setVisible(SUB81(pQVar2,0));
  }
  pQVar3 = q_func(in_RDI);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMdi::ControlContainer> *)0x63225d);
  if (!bVar1) {
    this_00 = (QPointer<QMdi::ControlContainer> *)operator_new(0x70);
    QMdi::ControlContainer::ControlContainer(in_stack_00000048,in_stack_00000040);
    QPointer<QMdi::ControlContainer>::operator=(this_00,in_stack_ffffffffffffffc8);
  }
  QPointer<QMdi::ControlContainer>::operator->((QPointer<QMdi::ControlContainer> *)0x6322a4);
  QMdi::ControlContainer::controllerWidget((ControlContainer *)0x6322ac);
  pCVar4 = qobject_cast<QMdi::ControllerWidget*>((QObject *)0x6322b4);
  if (pCVar4 != (ControllerWidget *)0x0) {
    QMdi::ControllerWidget::setControlVisible
              ((ControllerWidget *)CONCAT44(in_ESI,uVar5),(WindowStateAction)((ulong)pQVar3 >> 0x20)
               ,SUB81((ulong)pQVar3 >> 0x18,0));
  }
  QWidget::update((QWidget *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void QMdiSubWindowPrivate::setVisible(WindowStateAction action, bool visible)
{
#ifndef QT_NO_ACTION
    if (actions[action])
        actions[action]->setVisible(visible);
#endif

    Q_Q(QMdiSubWindow);
    if (!controlContainer)
        controlContainer = new ControlContainer(q);

    if (ControllerWidget *ctrlWidget = qobject_cast<ControllerWidget *>
                                       (controlContainer->controllerWidget())) {
        ctrlWidget->setControlVisible(action, visible);
    }
    q->update();
}